

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  uint uVar2;
  Tag *pTVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  Tag *__s;
  size_t __n;
  bool bVar8;
  
  iVar1 = this->tags_size_;
  uVar2 = this->tags_count_;
  bVar8 = true;
  if (iVar1 <= (int)uVar2) {
    iVar7 = 1;
    if (iVar1 != 0) {
      iVar7 = iVar1 * 2;
    }
    __n = (long)iVar7 * 0x10;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar7) {
      uVar6 = __n + 8;
    }
    plVar4 = (long *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    if (plVar4 == (long *)0x0) {
      __s = (Tag *)0x0;
    }
    else {
      *plVar4 = (long)iVar7;
      __s = (Tag *)(plVar4 + 1);
      memset(__s,0,__n);
    }
    bVar8 = __s != (Tag *)0x0;
    if (bVar8) {
      if (0 < (int)uVar2) {
        pTVar3 = this->tags_;
        lVar5 = 0;
        do {
          *(undefined8 *)((long)&__s->simple_tags_ + lVar5) =
               *(undefined8 *)((long)&pTVar3->simple_tags_ + lVar5);
          *(undefined4 *)((long)&__s->simple_tags_size_ + lVar5) =
               *(undefined4 *)((long)&pTVar3->simple_tags_size_ + lVar5);
          *(undefined4 *)((long)&__s->simple_tags_count_ + lVar5) =
               *(undefined4 *)((long)&pTVar3->simple_tags_count_ + lVar5);
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar5);
      }
      if (this->tags_ != (Tag *)0x0) {
        operator_delete__(&this->tags_[-1].simple_tags_size_);
      }
      this->tags_ = __s;
      this->tags_size_ = iVar7;
    }
  }
  return bVar8;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (tags_size_ > tags_count_)
    return true;  // nothing to do yet

  const int size = (tags_size_ == 0) ? 1 : 2 * tags_size_;

  Tag* const tags = new (std::nothrow) Tag[size];  // NOLINT
  if (tags == NULL)
    return false;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& src = tags_[idx];
    Tag* const dst = tags + idx;
    src.ShallowCopy(dst);
  }

  delete[] tags_;

  tags_ = tags;
  tags_size_ = size;

  return true;
}